

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::retrieveNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *cur;
  char *memory_local;
  MemoryLeakDetectorList *this_local;
  
  cur = this->head_;
  while( true ) {
    if (cur == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (*(char **)(cur + 0x10) == memory) break;
    cur = *(MemoryLeakDetectorNode **)(cur + 0x38);
  }
  return cur;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::retrieveNode(char* memory)
{
  MemoryLeakDetectorNode* cur = head_;
  while (cur) {
    if (cur->memory_ == memory)
      return cur;
    cur = cur->next_;
  }
  return NULLPTR;
}